

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

SmallVector<llvm::StringRef,_2U> *
getNames(SmallVector<llvm::StringRef,_2U> *__return_storage_ptr__,DWARFDie *DIE,
        bool IncludeLinkageName)

{
  StringRef LHS;
  bool bVar1;
  Tag TVar2;
  char *Str_00;
  reference pSVar3;
  StringRef local_40;
  char *local_30;
  char *Str;
  
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &__return_storage_ptr__->super_SmallVectorStorage<llvm::StringRef,_2U>;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  (__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 2;
  local_30 = llvm::DWARFDie::getName(DIE,ShortName);
  if (local_30 == (char *)0x0) {
    TVar2 = llvm::DWARFDie::getTag(DIE);
    if (TVar2 == DW_TAG_namespace) {
      llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
                (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                 (char (*) [22])"(anonymous namespace)");
    }
  }
  else {
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_30);
  }
  if ((IncludeLinkageName) &&
     (Str_00 = llvm::DWARFDie::getName(DIE,LinkageName), Str_00 != (char *)0x0)) {
    local_30 = Str_00;
    if ((__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>).
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0) {
      pSVar3 = llvm::SmallVectorTemplateCommon<llvm::StringRef,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)__return_storage_ptr__
                          ,0);
      LHS = *pSVar3;
      llvm::StringRef::StringRef(&local_40,Str_00);
      bVar1 = llvm::operator!=(LHS,local_40);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
    }
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static SmallVector<StringRef, 2> getNames(const DWARFDie &DIE,
                                          bool IncludeLinkageName = true) {
  SmallVector<StringRef, 2> Result;
  if (const char *Str = DIE.getName(DINameKind::ShortName))
    Result.emplace_back(Str);
  else if (DIE.getTag() == dwarf::DW_TAG_namespace)
    Result.emplace_back("(anonymous namespace)");

  if (IncludeLinkageName) {
    if (const char *Str = DIE.getName(DINameKind::LinkageName)) {
      if (Result.empty() || Result[0] != Str)
        Result.emplace_back(Str);
    }
  }

  return Result;
}